

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfunc.cpp
# Opt level: O0

char * __thiscall CVmDbgFrameSymPtr::get_symptr(CVmDbgFrameSymPtr *this)

{
  int iVar1;
  char *p;
  long *in_RDI;
  char *symp;
  undefined8 in_stack_fffffffffffffff8;
  pool_ofs_t ofs;
  
  ofs = (pool_ofs_t)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  p = (char *)(*in_RDI + G_dbg_lclsym_hdr_size_X);
  iVar1 = is_sym_inline((CVmDbgFrameSymPtr *)0x3548e4);
  if (iVar1 == 0) {
    ::osrp4(p);
    p = CVmPoolInMem::get_ptr((CVmPoolInMem *)symp,ofs);
  }
  return p;
}

Assistant:

const char *CVmDbgFrameSymPtr::get_symptr(VMG0_) const
{
    /* get a pointer to the symbol field in this record */
    const char *symp = (const char *)p_ + G_dbg_lclsym_hdr_size;

    /* 
     *   if it's stored inline, this points directly to the symbol data;
     *   otherwise it's a constant pool offset pointing to the symbol data 
     */
    if (is_sym_inline())
        return symp;
    else
        return G_const_pool->get_ptr(osrp4(symp));
}